

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_get_env_cell(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,
                 sexp_conflict id,sexp_conflict createp)

{
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  long in_R9;
  sexp_conflict cell;
  sexp_conflict local_48;
  sexp_conflict local_40;
  int *local_30;
  int *local_28;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x17)) {
    local_40 = (sexp_conflict)sexp_env_cell(in_RDI,in_RCX,in_R8,0);
    if (local_40 == (sexp_conflict)0x0) {
      local_30 = in_R8;
      local_28 = in_RCX;
      if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0x16)) {
        local_28 = *(int **)(in_R8 + 2);
        local_30 = *(int **)(in_R8 + 6);
      }
      local_40 = (sexp_conflict)sexp_env_cell(in_RDI,local_28,local_30,0);
      if ((local_40 == (sexp_conflict)0x0) && (in_R9 != 0x3e)) {
        local_40 = (sexp_conflict)sexp_env_cell_define(in_RDI,local_28,local_30,0x53e,0);
      }
    }
    if (local_40 == (sexp_conflict)0x0) {
      local_48 = (sexp_conflict)0x3e;
    }
    else {
      local_48 = local_40;
    }
    local_8 = local_48;
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x17,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_get_env_cell (sexp ctx, sexp self, sexp_sint_t n, sexp env, sexp id, sexp createp) {
  sexp cell;
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  cell = sexp_env_cell(ctx, env, id, 0);
  if (! cell) {
    if (sexp_synclop(id)) {
      env = sexp_synclo_env(id);
      id = sexp_synclo_expr(id);
    }
    cell = sexp_env_cell(ctx, env, id, 0);
    if (!cell && sexp_truep(createp))
      cell = sexp_env_cell_define(ctx, env, id, SEXP_UNDEF, NULL);
  }
  return cell ? cell : SEXP_FALSE;
}